

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx::OrientedDiscMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar34;
  float fVar35;
  undefined1 auVar31 [16];
  float fVar36;
  undefined1 auVar32 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined1 auVar33 [64];
  
  pSVar7 = context->scene;
  uVar21 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar8 = (pSVar7->geometries).items[Disc->sharedGeomID].ptr;
  lVar9 = *(long *)&pGVar8->field_0x58;
  _Var10 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar22 = *(undefined1 (*) [16])(lVar9 + _Var10 * uVar21);
  uVar20 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar27 = *(undefined1 (*) [16])(lVar9 + _Var10 * uVar20);
  uVar18 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar23 = *(undefined1 (*) [16])(lVar9 + _Var10 * uVar18);
  uVar19 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar26 = *(undefined1 (*) [16])(lVar9 + _Var10 * uVar19);
  auVar37 = vunpcklps_avx(auVar22,auVar23);
  auVar28 = vunpckhps_avx(auVar22,auVar23);
  auVar22 = vunpcklps_avx(auVar27,auVar26);
  auVar29 = vunpckhps_avx(auVar27,auVar26);
  auVar24 = vunpcklps_avx(auVar37,auVar22);
  local_198 = vunpckhps_avx(auVar37,auVar22);
  auVar16 = vunpcklps_avx(auVar28,auVar29);
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  p_Var11 = pGVar8[1].intersectionFilterN;
  auVar22 = *(undefined1 (*) [16])(lVar9 + uVar21 * (long)p_Var11);
  auVar27 = *(undefined1 (*) [16])(lVar9 + uVar20 * (long)p_Var11);
  auVar23 = *(undefined1 (*) [16])(lVar9 + uVar18 * (long)p_Var11);
  auVar26 = *(undefined1 (*) [16])(lVar9 + (long)p_Var11 * uVar19);
  auVar37 = vunpcklps_avx(auVar22,auVar23);
  auVar22 = vunpckhps_avx(auVar22,auVar23);
  auVar23 = vunpcklps_avx(auVar27,auVar26);
  auVar27 = vunpckhps_avx(auVar27,auVar26);
  local_d8 = vunpcklps_avx(auVar22,auVar27);
  local_f8 = vunpcklps_avx(auVar37,auVar23);
  local_e8 = vunpckhps_avx(auVar37,auVar23);
  local_138 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar30 = *(float *)(ray + k * 4 + 0x10);
  auVar37._4_4_ = fVar30;
  auVar37._0_4_ = fVar30;
  auVar37._8_4_ = fVar30;
  auVar37._12_4_ = fVar30;
  fVar34 = *(float *)(ray + k * 4 + 0x20);
  auVar40._4_4_ = fVar34;
  auVar40._0_4_ = fVar34;
  auVar40._8_4_ = fVar34;
  auVar40._12_4_ = fVar34;
  fVar35 = *(float *)(ray + k * 4 + 0x40);
  fVar36 = *(float *)(ray + k * 4 + 0x50);
  fVar1 = *(float *)(ray + k * 4 + 0x60);
  auVar22._0_4_ = fVar35 * local_f8._0_4_ + fVar36 * local_e8._0_4_ + fVar1 * local_d8._0_4_;
  auVar22._4_4_ = fVar35 * local_f8._4_4_ + fVar36 * local_e8._4_4_ + fVar1 * local_d8._4_4_;
  auVar22._8_4_ = fVar35 * local_f8._8_4_ + fVar36 * local_e8._8_4_ + fVar1 * local_d8._8_4_;
  auVar22._12_4_ = fVar35 * local_f8._12_4_ + fVar36 * local_e8._12_4_ + fVar1 * local_d8._12_4_;
  auVar27 = vcmpps_avx(ZEXT416(0) << 0x20,auVar22,4);
  auVar42._8_4_ = 0x3f800000;
  auVar42._0_8_ = 0x3f8000003f800000;
  auVar42._12_4_ = 0x3f800000;
  auVar22 = vblendvps_avx(auVar42,auVar22,auVar27);
  auVar23 = vsubps_avx(auVar16,auVar40);
  auVar26 = vsubps_avx(local_198,auVar37);
  fVar2 = *(float *)(ray + k * 4);
  auVar44._4_4_ = fVar2;
  auVar44._0_4_ = fVar2;
  auVar44._8_4_ = fVar2;
  auVar44._12_4_ = fVar2;
  auVar37 = vsubps_avx(auVar24,auVar44);
  auVar25._0_4_ =
       auVar26._0_4_ * local_e8._0_4_ + auVar23._0_4_ * local_d8._0_4_ +
       local_f8._0_4_ * auVar37._0_4_;
  auVar25._4_4_ =
       auVar26._4_4_ * local_e8._4_4_ + auVar23._4_4_ * local_d8._4_4_ +
       local_f8._4_4_ * auVar37._4_4_;
  auVar25._8_4_ =
       auVar26._8_4_ * local_e8._8_4_ + auVar23._8_4_ * local_d8._8_4_ +
       local_f8._8_4_ * auVar37._8_4_;
  auVar25._12_4_ =
       auVar26._12_4_ * local_e8._12_4_ + auVar23._12_4_ * local_d8._12_4_ +
       local_f8._12_4_ * auVar37._12_4_;
  local_108 = vdivps_avx(auVar25,auVar22);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar23._4_4_ = uVar3;
  auVar23._0_4_ = uVar3;
  auVar23._8_4_ = uVar3;
  auVar23._12_4_ = uVar3;
  auVar22 = vcmpps_avx(auVar23,local_108,2);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar26._4_4_ = uVar3;
  auVar26._0_4_ = uVar3;
  auVar26._8_4_ = uVar3;
  auVar26._12_4_ = uVar3;
  auVar23 = vcmpps_avx(local_108,auVar26,2);
  auVar22 = vandps_avx(auVar23,auVar22);
  auVar23 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar23 = vpcmpgtd_avx(auVar23,_DAT_01f4ad30);
  auVar22 = vandps_avx(auVar22,auVar23);
  auVar23 = auVar27 & auVar22;
  if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar23[0xf] < '\0') {
    auVar22 = vandps_avx(auVar27,auVar22);
    auVar37 = vunpckhps_avx(auVar28,auVar29);
    fVar12 = local_108._0_4_;
    fVar13 = local_108._4_4_;
    fVar14 = local_108._8_4_;
    fVar15 = local_108._12_4_;
    auVar29._0_4_ = fVar2 + fVar35 * fVar12;
    auVar29._4_4_ = fVar2 + fVar35 * fVar13;
    auVar29._8_4_ = fVar2 + fVar35 * fVar14;
    auVar29._12_4_ = fVar2 + fVar35 * fVar15;
    auVar31._0_4_ = fVar30 + fVar36 * fVar12;
    auVar31._4_4_ = fVar30 + fVar36 * fVar13;
    auVar31._8_4_ = fVar30 + fVar36 * fVar14;
    auVar31._12_4_ = fVar30 + fVar36 * fVar15;
    auVar38._0_4_ = fVar34 + fVar1 * fVar12;
    auVar38._4_4_ = fVar34 + fVar1 * fVar13;
    auVar38._8_4_ = fVar34 + fVar1 * fVar14;
    auVar38._12_4_ = fVar34 + fVar1 * fVar15;
    auVar27 = vsubps_avx(auVar29,auVar24);
    auVar23 = vsubps_avx(auVar31,local_198);
    auVar26 = vsubps_avx(auVar38,auVar16);
    fVar30 = auVar23._0_4_ * auVar23._0_4_;
    fVar34 = auVar23._4_4_ * auVar23._4_4_;
    fVar35 = auVar23._8_4_ * auVar23._8_4_;
    fVar36 = auVar23._12_4_ * auVar23._12_4_;
    auVar28._0_4_ = auVar27._0_4_ * auVar27._0_4_ + fVar30 + auVar26._0_4_ * auVar26._0_4_;
    auVar28._4_4_ = auVar27._4_4_ * auVar27._4_4_ + fVar34 + auVar26._4_4_ * auVar26._4_4_;
    auVar28._8_4_ = auVar27._8_4_ * auVar27._8_4_ + fVar35 + auVar26._8_4_ * auVar26._8_4_;
    auVar28._12_4_ = auVar27._12_4_ * auVar27._12_4_ + fVar36 + auVar26._12_4_ * auVar26._12_4_;
    auVar27._0_4_ = auVar37._0_4_ * auVar37._0_4_;
    auVar27._4_4_ = auVar37._4_4_ * auVar37._4_4_;
    auVar27._8_4_ = auVar37._8_4_ * auVar37._8_4_;
    auVar27._12_4_ = auVar37._12_4_ * auVar37._12_4_;
    auVar27 = vcmpps_avx(auVar28,auVar27,1);
    auVar22 = vandps_avx(auVar27,auVar22);
    iVar17 = vmovmskps_avx(auVar22);
    if (iVar17 != 0) {
      local_128 = ZEXT832(0) << 0x20;
      uVar21 = (ulong)(byte)iVar17;
      auVar32 = ZEXT1632(CONCAT412(fVar36,CONCAT48(fVar35,CONCAT44(fVar34,fVar30))));
      auVar32 = vcmpps_avx(auVar32,auVar32,0xf);
      auVar33 = ZEXT3264(auVar32);
      auVar39 = ZEXT464(0) << 0x20;
      auVar22 = vpcmpeqd_avx(auVar40,auVar40);
      auVar41 = ZEXT1664(auVar22);
      auVar43 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      do {
        args.hit = local_c8;
        args.valid = (int *)local_1a8;
        uVar18 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        uVar6 = *(uint *)(local_138 + uVar18 * 4);
        pGVar8 = (pSVar7->geometries).items[uVar6].ptr;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_98 = *(undefined4 *)(local_128 + uVar18 * 4);
          uVar4 = *(undefined4 *)(local_128 + uVar18 * 4 + 0x10);
          local_88._4_4_ = uVar4;
          local_88._0_4_ = uVar4;
          local_88._8_4_ = uVar4;
          local_88._12_4_ = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_108 + uVar18 * 4);
          args.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar6),0);
          uVar6 = (Disc->primIDs).field_0.i[uVar18];
          local_78._4_4_ = uVar6;
          local_78._0_4_ = uVar6;
          local_78._8_4_ = uVar6;
          local_78._12_4_ = uVar6;
          uVar4 = *(undefined4 *)(local_f8 + uVar18 * 4);
          uVar5 = *(undefined4 *)(local_e8 + uVar18 * 4);
          local_b8._4_4_ = uVar5;
          local_b8._0_4_ = uVar5;
          local_b8._8_4_ = uVar5;
          local_b8._12_4_ = uVar5;
          uVar5 = *(undefined4 *)(local_d8 + uVar18 * 4);
          local_a8._4_4_ = uVar5;
          local_a8._0_4_ = uVar5;
          local_a8._8_4_ = uVar5;
          local_a8._12_4_ = uVar5;
          local_c8[0] = (RTCHitN)(char)uVar4;
          local_c8[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_c8[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_c8[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_c8[4] = (RTCHitN)(char)uVar4;
          local_c8[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_c8[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_c8[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_c8[8] = (RTCHitN)(char)uVar4;
          local_c8[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_c8[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_c8[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_c8[0xc] = (RTCHitN)(char)uVar4;
          local_c8[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_c8[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_c8[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_54 = (args.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (args.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_1a8 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          args.geometryUserPtr = pGVar8->userPtr;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_198._0_8_ = Disc;
            auVar32 = ZEXT1632(auVar33._0_16_);
            auVar22 = auVar41._0_16_;
            (*pGVar8->occlusionFilterN)(&args);
            auVar43 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar22 = vpcmpeqd_avx(auVar22,auVar22);
            auVar41 = ZEXT1664(auVar22);
            auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar32 = vcmpps_avx(auVar32,auVar32,0xf);
            auVar33 = ZEXT3264(auVar32);
            Disc = (Primitive *)local_198._0_8_;
          }
          auVar22 = auVar41._0_16_;
          if (local_1a8 == (undefined1  [16])0x0) {
            auVar27 = vpcmpeqd_avx(auVar39._0_16_,(undefined1  [16])0x0);
            auVar22 = auVar22 ^ auVar27;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              auVar32 = ZEXT1632(auVar33._0_16_);
              (*p_Var11)(&args);
              auVar43 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar22 = vpcmpeqd_avx(auVar22,auVar22);
              auVar41 = ZEXT1664(auVar22);
              auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar32 = vcmpps_avx(auVar32,auVar32,0xf);
              auVar33 = ZEXT3264(auVar32);
            }
            auVar27 = vpcmpeqd_avx(auVar39._0_16_,local_1a8);
            auVar22 = auVar41._0_16_ ^ auVar27;
            auVar27 = vblendvps_avx(auVar43._0_16_,*(undefined1 (*) [16])(args.ray + 0x80),auVar27);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar27;
          }
          auVar24._8_8_ = 0x100000001;
          auVar24._0_8_ = 0x100000001;
          if ((auVar24 & auVar22) != (undefined1  [16])0x0) {
            return true;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = uVar3;
        }
        uVar21 = uVar21 ^ 1L << (uVar18 & 0x3f);
      } while (uVar21 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }